

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

bool check_dispel(int dis_level,CHAR_DATA *victim,int sn)

{
  bool bVar1;
  int in_EDX;
  CHAR_DATA *in_RSI;
  __type_conflict2 _Var2;
  AFFECT_DATA *af;
  void *arg2;
  AFFECT_DATA *arg1;
  int in_stack_ffffffffffffffe8;
  
  bVar1 = is_affected(in_RSI,(int)gsn_indom);
  if (bVar1) {
    send_to_char((char *)in_RSI,(CHAR_DATA *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  }
  else {
    bVar1 = is_affected(in_RSI,in_EDX);
    if (bVar1) {
      for (arg1 = in_RSI->affected; arg1 != (AFFECT_DATA *)0x0; arg1 = arg1->next) {
        if ((arg1->type == in_EDX) &&
           (bVar1 = saves_dispel((int)in_RSI,in_EDX,in_stack_ffffffffffffffe8), !bVar1)) {
          arg2 = (void *)arg1->bitvector[0];
          _Var2 = std::pow<int,int>(0,0x60f06c);
          if (((ulong)arg2 & (long)_Var2) == 0) {
            affect_strip(in_RSI,in_EDX);
            bVar1 = str_cmp(skill_table[in_EDX].msg_off,"");
            if (bVar1) {
              send_to_char((char *)in_RSI,(CHAR_DATA *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
              send_to_char((char *)in_RSI,(CHAR_DATA *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
            }
            bVar1 = str_cmp(skill_table[in_EDX].room_msg_off,"");
            if (bVar1) {
              act((char *)in_RSI,(CHAR_DATA *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),arg1,arg2,0
                 );
            }
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool check_dispel(int dis_level, CHAR_DATA *victim, int sn)
{
	AFFECT_DATA *af;

	if (is_affected(victim, gsn_indom))
	{
		send_to_char("Your body's state is maintained by the force of your will.\n\r", victim);
		return false;
	}

	if (is_affected(victim, sn))
	{
		for (af = victim->affected; af != nullptr; af = af->next)
		{
			if (af->type == sn)
			{
				if (!saves_dispel(dis_level, af->level, af->duration) && !IS_SET(af->bitvector, AFF_PERMANENT))
				{
					affect_strip(victim, sn);

					if (str_cmp(skill_table[sn].msg_off, ""))
					{
						send_to_char(skill_table[sn].msg_off, victim);
						send_to_char("\n\r", victim);
					}

					if (str_cmp(skill_table[sn].room_msg_off, ""))
						act(skill_table[sn].room_msg_off, victim, 0, 0, TO_ROOM);

					return true;
				}
			}
		}
	}

	return false;
}